

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

int __thiscall
glcts::ExtensionDirectiveTestCaseGroup::init
          (ExtensionDirectiveTestCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ExtensionDirectiveTestCase *pEVar1;
  
  pEVar1 = (ExtensionDirectiveTestCase *)operator_new(0xa8);
  ExtensionDirectiveTestCase::ExtensionDirectiveTestCase
            (pEVar1,(this->super_TestCaseGroup).m_context,this->m_glslVersion,"disable");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pEVar1);
  pEVar1 = (ExtensionDirectiveTestCase *)operator_new(0xa8);
  ExtensionDirectiveTestCase::ExtensionDirectiveTestCase
            (pEVar1,(this->super_TestCaseGroup).m_context,this->m_glslVersion,"enable");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pEVar1);
  pEVar1 = (ExtensionDirectiveTestCase *)operator_new(0xa8);
  ExtensionDirectiveTestCase::ExtensionDirectiveTestCase
            (pEVar1,(this->super_TestCaseGroup).m_context,this->m_glslVersion,"warn");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pEVar1);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(new ExtensionDirectiveTestCase(m_context, m_glslVersion, "disable"));
		addChild(new ExtensionDirectiveTestCase(m_context, m_glslVersion, "enable"));
		addChild(new ExtensionDirectiveTestCase(m_context, m_glslVersion, "warn"));
	}